

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AggregateMarking.cpp
# Opt level: O3

KString * __thiscall
KDIS::DATA_TYPE::AggregateMarking::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,AggregateMarking *this)

{
  ostream *poVar1;
  size_t sVar2;
  KStringStream ss;
  long *local_1d0;
  long local_1c8;
  long local_1c0 [2];
  stringstream local_1b0 [16];
  ostream local_1a0 [112];
  ios_base local_130 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b0);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a0,"Aggregate Marking:",0x12);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a0,"\n\tMaring Char Set:      ",0x18);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n\tMarking String:       ",0x18);
  local_1d0 = local_1c0;
  sVar2 = strlen(this->m_sAggregateMarkingString);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1d0,this->m_sAggregateMarkingString,
             this->m_sAggregateMarkingString + sVar2);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)local_1d0,local_1c8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  if (local_1d0 != local_1c0) {
    operator_delete(local_1d0,local_1c0[0] + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b0);
  std::ios_base::~ios_base(local_130);
  return __return_storage_ptr__;
}

Assistant:

KString AggregateMarking::GetAsString() const
{
    KStringStream ss;

    ss << "Aggregate Marking:"
       << "\n\tMaring Char Set:      " << ( KUINT16 )m_ui8AggregateMarkingCharacterSet
       << "\n\tMarking String:       " << GetAggregateMarkingString()
       << "\n";

    return ss.str();
}